

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_exporter.cpp
# Opt level: O0

void Assimp::Write(JSONWriter *out,aiNode *ai,bool is_elem)

{
  aiNode *paVar1;
  uint local_d0;
  allocator<char> local_c9;
  uint n_1;
  uint local_a8;
  allocator<char> local_a1;
  uint n;
  allocator<char> local_79;
  string local_78;
  allocator<char> local_41;
  string local_40;
  undefined1 local_19;
  aiNode *paStack_18;
  bool is_elem_local;
  aiNode *ai_local;
  JSONWriter *out_local;
  
  local_19 = is_elem;
  paStack_18 = ai;
  ai_local = (aiNode *)out;
  JSONWriter::StartObj(out,is_elem);
  paVar1 = ai_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"name",&local_41);
  JSONWriter::Key((JSONWriter *)paVar1,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  JSONWriter::SimpleValue<aiString>((JSONWriter *)ai_local,&paStack_18->mName);
  paVar1 = ai_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"transformation",&local_79)
  ;
  JSONWriter::Key((JSONWriter *)paVar1,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator(&local_79);
  Write((JSONWriter *)ai_local,&paStack_18->mTransformation,false);
  paVar1 = ai_local;
  if (paStack_18->mNumMeshes != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&n,"meshes",&local_a1);
    JSONWriter::Key((JSONWriter *)paVar1,(string *)&n);
    std::__cxx11::string::~string((string *)&n);
    std::allocator<char>::~allocator(&local_a1);
    JSONWriter::StartArray((JSONWriter *)ai_local,false);
    for (local_a8 = 0; local_a8 < paStack_18->mNumMeshes; local_a8 = local_a8 + 1) {
      JSONWriter::Element<unsigned_int>((JSONWriter *)ai_local,paStack_18->mMeshes + local_a8);
    }
    JSONWriter::EndArray((JSONWriter *)ai_local);
  }
  paVar1 = ai_local;
  if (paStack_18->mNumChildren != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&n_1,"children",&local_c9);
    JSONWriter::Key((JSONWriter *)paVar1,(string *)&n_1);
    std::__cxx11::string::~string((string *)&n_1);
    std::allocator<char>::~allocator(&local_c9);
    JSONWriter::StartArray((JSONWriter *)ai_local,false);
    for (local_d0 = 0; local_d0 < paStack_18->mNumChildren; local_d0 = local_d0 + 1) {
      Write((JSONWriter *)ai_local,paStack_18->mChildren[local_d0],true);
    }
    JSONWriter::EndArray((JSONWriter *)ai_local);
  }
  JSONWriter::EndObj((JSONWriter *)ai_local);
  return;
}

Assistant:

void Write(JSONWriter& out, const aiNode& ai, bool is_elem = true) {
    out.StartObj(is_elem);

    out.Key("name");
    out.SimpleValue(ai.mName);

    out.Key("transformation");
    Write(out, ai.mTransformation, false);

    if (ai.mNumMeshes) {
        out.Key("meshes");
        out.StartArray();
        for (unsigned int n = 0; n < ai.mNumMeshes; ++n) {
            out.Element(ai.mMeshes[n]);
        }
        out.EndArray();
    }

    if (ai.mNumChildren) {
        out.Key("children");
        out.StartArray();
        for (unsigned int n = 0; n < ai.mNumChildren; ++n) {
            Write(out, *ai.mChildren[n]);
        }
        out.EndArray();
    }

    out.EndObj();
}